

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# standard_hash_table.hpp
# Opt level: O2

bool __thiscall
poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::set
          (standard_hash_table<80U,_poplar::hash::vigna_hasher> *this,uint64_t key,uint64_t val)

{
  pointer psVar1;
  pointer psVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  standard_hash_table<80U,_poplar::hash::vigna_hasher> sStack_58;
  
  if ((this->table_).
      super__Vector_base<poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::slot_type,_std::allocator<poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::slot_type>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (this->table_).
      super__Vector_base<poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::slot_type,_std::allocator<poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::slot_type>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    standard_hash_table(&sStack_58,6);
    operator=(this,&sStack_58);
    std::
    _Vector_base<poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::slot_type,_std::allocator<poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::slot_type>_>
    ::~_Vector_base((_Vector_base<poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::slot_type,_std::allocator<poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::slot_type>_>
                     *)&sStack_58);
  }
  if (this->max_size_ <= this->size_) {
    expand_(this);
  }
  uVar4 = init_id_(this,key);
  psVar2 = (this->table_).
           super__Vector_base<poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::slot_type,_std::allocator<poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::slot_type>_>
           ._M_impl.super__Vector_impl_data._M_start;
  do {
    psVar1 = psVar2 + uVar4;
    uVar3 = psVar2[uVar4].key;
    if (uVar3 == 0xffffffffffffffff) {
      psVar1->key = key;
      psVar1->val = val;
      this->size_ = this->size_ + 1;
LAB_00144c6d:
      return uVar3 == 0xffffffffffffffff;
    }
    if (uVar3 == key) {
      psVar1->val = val;
      goto LAB_00144c6d;
    }
    uVar4 = uVar4 + 1 & (this->capa_size_).mask_;
  } while( true );
}

Assistant:

bool set(uint64_t key, uint64_t val) {
        if (table_.empty()) {
            *this = this_type(min_capa_bits);
        }

        if (max_size_ <= size_) {
            expand_();
        }

        for (uint64_t i = init_id_(key);; i = right_(i)) {
            if (table_[i].key == UINT64_MAX) {
                table_[i] = {key, val};
                ++size_;
                return true;
            }
            if (table_[i].key == key) {
                table_[i].val = val;
                return false;
            }
        }
    }